

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

FieldDescriptorProto *
google::protobuf::descriptor_unittest::AddField
          (DescriptorProto *parent,string *name,int number,Label label,Type type)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *this;
  Arena *arena;
  
  this = internal::RepeatedPtrFieldBase::
         Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                   (&(parent->field_0)._impl_.field_.super_RepeatedPtrFieldBase);
  *(byte *)&this->field_0 = *(byte *)&this->field_0 | 1;
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.name_,name,arena);
  (this->field_0)._impl_.number_ = number;
  *(byte *)&this->field_0 = *(byte *)&this->field_0 | 0x40;
  FieldDescriptorProto::set_label(this,label);
  FieldDescriptorProto::set_type(this,type);
  return this;
}

Assistant:

FieldDescriptorProto* AddField(DescriptorProto* parent, const std::string& name,
                               int number, FieldDescriptorProto::Label label,
                               FieldDescriptorProto::Type type) {
  FieldDescriptorProto* result = parent->add_field();
  result->set_name(name);
  result->set_number(number);
  result->set_label(label);
  result->set_type(type);
  return result;
}